

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stretch.cpp
# Opt level: O3

void doStretch(MidiFile *midifile,double bars,double duration)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MidiEventList *this;
  MidiEvent *this_00;
  int ticks;
  
  iVar1 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  ticks = 0x6000;
  if (0x6000 < iVar1) {
    ticks = iVar1;
  }
  smf::MidiFile::setTicksPerQuarterNote(midifile,ticks);
  iVar2 = smf::MidiFile::size(midifile);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      this = smf::MidiFile::operator[](midifile,iVar2);
      iVar3 = smf::MidiEventList::size(this);
      if (0 < iVar3) {
        iVar3 = 0;
        do {
          this_00 = smf::MidiEventList::operator[](this,iVar3);
          this_00->tick =
               (int)((double)this_00->tick * (((double)ticks / (double)iVar1) / bars)) *
               this_00->tick;
          iVar4 = smf::MidiMessage::getMetaType(&this_00->super_MidiMessage);
          if (iVar4 == 0x51) {
            iVar4 = smf::MidiMessage::getTempoMicroseconds(&this_00->super_MidiMessage);
            smf::MidiMessage::setTempoMicroseconds
                      (&this_00->super_MidiMessage,(int)((double)iVar4 * bars * duration));
          }
          iVar3 = iVar3 + 1;
          iVar4 = smf::MidiEventList::size(this);
        } while (iVar3 < iVar4);
      }
      iVar2 = iVar2 + 1;
      iVar3 = smf::MidiFile::size(midifile);
    } while (iVar2 < iVar3);
  }
  return;
}

Assistant:

void doStretch(MidiFile& midifile, double bars, double duration) {
	int ppqn = midifile.getTicksPerQuarterNote();
	int new_ppqn = max( 24576, ppqn );
	midifile.setTicksPerQuarterNote( new_ppqn );
	double tick_mult = (double)new_ppqn / (double)ppqn;
	tick_mult /= bars;

	for (int t = 0; t < midifile.size(); ++t) {
		MidiEventList &track = midifile[t];
		for (int e = 0; e < track.size(); ++e) {
			MidiEvent &event = track[e];
			event.tick *= (int)(event.tick * tick_mult);
			if (event.getMetaType() == 0x51) {
			double tempo = event.getTempoMicroseconds();
			tempo *= bars;
			tempo *= duration;
			event.setTempoMicroseconds( (int)tempo );
			}
		}
	}
}